

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.hpp
# Opt level: O1

bool udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
               (SerializeDirection direction,unsigned_long *value,BufferView *buffer_view)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = true;
  if (direction == kParse) {
    *value = 0;
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + 8) {
      bVar2 = false;
    }
    else {
      lVar3 = 0x38;
      do {
        bVar1 = BufferView::Read(buffer_view);
        *value = *value | (ulong)bVar1 << ((byte)lVar3 & 0x3f);
        lVar3 = lVar3 + -8;
      } while (lVar3 != -8);
    }
  }
  else if (direction == kSerialize) {
    lVar3 = 0x38;
    do {
      std::__cxx11::string::push_back((char)buffer_view->buffer_);
      lVar3 = lVar3 + -8;
    } while (lVar3 != -8);
  }
  return bVar2;
}

Assistant:

bool SerializeUnsignedIntegerBigEndian(SerializeDirection direction,
                                       ValueType* value,
                                       BufferView* buffer_view) {
  switch (direction) {
    case kSerialize: {
      int n = sizeof(ValueType);
      for (int i = 0; i < n; ++i) {
        uint8_t c = (uint8_t)((*value) >> ((n - i - 1) * 8)) & 0xff;
        buffer_view->push_back(c);
      }
    } break;

    case kParse:
      *value = 0;
      if (buffer_view->CanRead(sizeof(ValueType))) {
        int n = sizeof(ValueType);
        for (int i = 0; i < n; ++i) {
          ValueType v = (uint8_t)buffer_view->Read();
          *value |= (v << ((n - i - 1) * 8));
        }
      } else {
        return false;
      }
      break;
  }

  return true;
}